

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O2

_Bool plutovg_skip_ws_and_delim(char **begin,char *end,char delim)

{
  _Bool _Var1;
  char *it;
  char *local_28;
  
  local_28 = *begin;
  _Var1 = plutovg_skip_ws(&local_28,end);
  if (((_Var1) && (local_28 < end)) && (*local_28 == delim)) {
    local_28 = local_28 + 1;
    plutovg_skip_ws(&local_28,end);
    *begin = local_28;
    _Var1 = local_28 < end;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static inline bool plutovg_skip_ws_and_delim(const char** begin, const char* end, char delim)
{
    const char* it = *begin;
    if(plutovg_skip_ws(&it, end)) {
        if(!plutovg_skip_delim(&it, end, delim))
            return false;
        plutovg_skip_ws(&it, end);
    } else {
        return false;
    }

    *begin = it;
    return it < end;
}